

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_half_to_float_4chan_planar(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  exr_coding_channel_info_t *peVar6;
  int iVar7;
  int y;
  int iVar8;
  uint16_t *puVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  
  iVar7 = (decode->chunk).height - decode->user_line_end_ignore;
  iVar8 = decode->user_line_begin_skip;
  if (iVar8 < iVar7) {
    peVar6 = decode->channels;
    iVar1 = peVar6->width;
    lVar10 = (long)iVar1;
    pfVar13 = (float *)peVar6[3].field_12.decode_to_ptr;
    pfVar14 = (float *)peVar6[2].field_12.decode_to_ptr;
    pfVar11 = (float *)(peVar6->field_12).decode_to_ptr;
    pfVar12 = (float *)peVar6[1].field_12.decode_to_ptr;
    iVar2 = peVar6[3].user_line_stride;
    iVar3 = peVar6[2].user_line_stride;
    iVar4 = peVar6[1].user_line_stride;
    iVar5 = peVar6->user_line_stride;
    puVar9 = (uint16_t *)((long)(iVar1 * iVar8 * 8) + (long)decode->unpacked_buffer);
    do {
      (*half_to_float_buffer)(pfVar11,puVar9,iVar1);
      (*half_to_float_buffer)(pfVar12,puVar9 + lVar10,iVar1);
      (*half_to_float_buffer)(pfVar14,puVar9 + lVar10 * 2,iVar1);
      (*half_to_float_buffer)(pfVar13,puVar9 + lVar10 * 3,iVar1);
      pfVar11 = (float *)((long)pfVar11 + (long)iVar5);
      pfVar12 = (float *)((long)pfVar12 + (long)iVar4);
      pfVar14 = (float *)((long)pfVar14 + (long)iVar3);
      pfVar13 = (float *)((long)pfVar13 + (long)iVar2);
      iVar8 = iVar8 + 1;
      puVar9 = puVar9 + lVar10 * 4;
    } while (iVar8 < iVar7);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 8;

    // planar output
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion

        half_to_float_buffer ((float*) out0, in0, w);
        half_to_float_buffer ((float*) out1, in1, w);
        half_to_float_buffer ((float*) out2, in2, w);
        half_to_float_buffer ((float*) out3, in3, w);

        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}